

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpmemoryobject.h
# Opt level: O3

void __thiscall
jrtplib::RTPSourceData::RTPSourceData(RTPSourceData *this,uint32_t s,RTPMemoryManager *mgr)

{
  list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  *plVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  long lVar6;
  
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSourceData_0013ccc0;
  (this->packetlist).super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->packetlist;
  (this->packetlist).super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->packetlist;
  lVar4 = 0;
  (this->packetlist).super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
  _M_impl._M_node._M_size = 0;
  (this->SRinf).hasinfo = false;
  (this->RRinf).receivetime.m_t = 0.0;
  (this->RRinf).fractionlost = 0.0;
  (this->RRinf).packetslost = 0;
  (this->RRinf).exthighseqnr = 0;
  (this->RRinf).exthighseqnr = 0;
  (this->RRinf).jitter = 0;
  (this->RRinf).lsr = 0;
  (this->RRinf).dlsr = 0;
  (this->RRprevinf).receivetime.m_t = 0.0;
  (this->RRprevinf).hasinfo = false;
  (this->RRprevinf).fractionlost = 0.0;
  (this->RRprevinf).packetslost = 0;
  (this->RRprevinf).exthighseqnr = 0;
  (this->RRprevinf).exthighseqnr = 0;
  (this->RRprevinf).jitter = 0;
  (this->RRprevinf).lsr = 0;
  (this->RRprevinf).dlsr = 0;
  (this->stats).sentdata = false;
  (this->stats).probation = 0;
  (this->stats).packetsreceived = 0;
  (this->stats).numcycles = 0;
  (this->stats).baseseqnr = 0;
  (this->stats).exthighseqnr = 0;
  (this->stats).prevexthighseqnr = 0;
  (this->stats).jitter = 0;
  *(undefined8 *)&(this->stats).prevtimestamp = 0;
  *(undefined8 *)((long)&(this->stats).djitter + 4) = 0;
  *(undefined8 *)((long)&(this->stats).prevpacktime.m_t + 4) = 0;
  *(undefined8 *)((long)&(this->stats).lastmsgtime.m_t + 4) = 0;
  *(undefined8 *)((long)&(this->stats).lastrtptime.m_t + 4) = 0;
  *(undefined8 *)((long)&(this->stats).lastnotetime.m_t + 2) = 0;
  *(undefined8 *)((long)&(this->stats).numnewpackets + 2) = 0;
  *(undefined8 *)((long)&(this->SRinf).packetcount + 1) = 0;
  *(undefined8 *)((long)&(this->SRinf).receivetime.m_t + 1) = 0;
  (this->SRinf).ntptimestamp.msw = 0;
  (this->SRinf).ntptimestamp.lsw = 0;
  (this->SRinf).rtptimestamp = 0;
  (this->SRinf).packetcount = 0;
  *(undefined8 *)((long)&(this->SRprevinf).packetcount + 1) = 0;
  *(undefined8 *)((long)&(this->SRprevinf).receivetime.m_t + 1) = 0;
  (this->SRprevinf).ntptimestamp.msw = 0;
  (this->SRprevinf).ntptimestamp.lsw = 0;
  (this->SRprevinf).rtptimestamp = 0;
  (this->SRprevinf).packetcount = 0;
  (this->SDESinf).super_RTPMemoryObject.mgr = mgr;
  (this->SDESinf).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPSDESInfo_0013c9d0;
  do {
    *(undefined8 *)((long)&(this->SDESinf).nonprivateitems[0].super_RTPMemoryObject.mgr + lVar4) = 0
    ;
    *(undefined ***)
     ((long)&(this->SDESinf).nonprivateitems[0].super_RTPMemoryObject._vptr_RTPMemoryObject + lVar4)
         = &PTR__SDESItem_0013c9f0;
    puVar2 = (undefined8 *)((long)&(this->SDESinf).nonprivateitems[0].str + lVar4);
    *puVar2 = 0;
    puVar2[1] = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0xe0);
  plVar1 = &(this->SDESinf).privitems;
  (this->SDESinf).privitems.
  super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->SDESinf).privitems.
  super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->SDESinf).privitems.
  super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->SDESinf).curitem._M_node = (_List_node_base *)0x0;
  auVar3 = _DAT_001314b0;
  lVar4 = 0;
  auVar5 = _DAT_001314a0;
  do {
    if (SUB164(auVar5 ^ auVar3,4) == -0x80000000 && SUB164(auVar5 ^ auVar3,0) < -0x7ffffff9) {
      *(RTPMemoryManager **)
       ((long)&(this->SDESinf).nonprivateitems[0].super_RTPMemoryObject.mgr + lVar4) = mgr;
      *(RTPMemoryManager **)
       ((long)&(this->SDESinf).nonprivateitems[1].super_RTPMemoryObject.mgr + lVar4) = mgr;
    }
    lVar6 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 2;
    auVar5._8_8_ = lVar6 + 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x100);
  (this->byetime).m_t = 0.0;
  this->ssrc = s;
  this->timestampunit = -1.0;
  this->ownssrc = false;
  this->iscsrc = false;
  this->receivedbye = false;
  this->validated = false;
  this->processedinrtcp = false;
  this->issender = false;
  this->isrtpaddrset = false;
  this->isrtcpaddrset = false;
  this->rtpaddr = (RTPAddress *)0x0;
  this->rtcpaddr = (RTPAddress *)0x0;
  this->byereason = (uint8_t *)0x0;
  this->byereasonlen = 0;
  return;
}

Assistant:

RTPMemoryObject(RTPMemoryManager *memmgr) : mgr(memmgr)			{ }